

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

ctmbstr prvTidytmbsubstrn(ctmbstr s1,uint len1,ctmbstr s2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  
  lVar2 = 0;
  if ((s2 != (ctmbstr)0x0) && (*s2 != '\0')) {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while (s2[lVar1] != '\0');
  }
  iVar3 = len1 - (uint)lVar2;
  if (-1 < iVar3) {
    uVar4 = (ulong)(iVar3 + 1);
    do {
      iVar3 = prvTidytmbstrncmp(s1,s2,(uint)lVar2);
      if (iVar3 == 0) {
        return s1;
      }
      s1 = s1 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TY_(tmbsubstrn)( ctmbstr s1, uint len1, ctmbstr s2 )
{
    uint len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}